

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O1

void __thiscall InstructionInfo::generateOperandStruct(InstructionInfo *this,ostream *out)

{
  long lVar1;
  pointer pFVar2;
  pointer pFVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  vector<Field,_std::allocator<Field>_> *__range1;
  char *pcVar7;
  __normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_> __i;
  long lVar8;
  pointer pFVar9;
  vector<Field,_std::allocator<Field>_> sortedFields;
  vector<Field,_std::allocator<Field>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"struct Opcode_",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(out,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(out,"    TranslatedOpcode opcode;\n",0x1d);
  std::vector<Field,_std::allocator<Field>_>::vector(&local_48,&this->fields);
  pFVar3 = local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pFVar2 = local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar8 = (long)local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                  super__Vector_impl_data._M_start;
    uVar6 = (lVar8 >> 4) * -0x5555555555555555;
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
              (local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar8 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,__gnu_cxx::__ops::_Iter_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
                (pFVar2,pFVar3);
    }
    else {
      pFVar9 = pFVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,__gnu_cxx::__ops::_Iter_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
                (pFVar2,pFVar9);
      for (; pFVar9 != pFVar3; pFVar9 = pFVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Field*,std::vector<Field,std::allocator<Field>>>,__gnu_cxx::__ops::_Val_comp_iter<InstructionInfo::generateOperandStruct(std::ostream&)::__0>>
                  (pFVar9);
      }
    }
  }
  pFVar2 = local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (this->branch == true) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"    uint32_t CIA;\n",0x12);
    pFVar2 = local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  for (; pFVar2 != local_48.super__Vector_base<Field,_std::allocator<Field>_>._M_impl.
                   super__Vector_impl_data._M_finish; pFVar2 = pFVar2 + 1) {
    if (((pFVar2->name)._M_string_length != 0) && (pFVar2->match == false)) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"    ",4);
      iVar4 = pFVar2->to - pFVar2->from;
      pcVar7 = "uint8_t";
      if (8 < iVar4) {
        pcVar7 = "uint16_t";
      }
      if (0x10 < iVar4) {
        pcVar7 = "uint32_t";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar7,(ulong)(8 < iVar4) + 7);
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(pFVar2->name)._M_dataplus._M_p,(pFVar2->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"};\n\n",4);
  std::vector<Field,_std::allocator<Field>_>::~vector(&local_48);
  return;
}

Assistant:

void InstructionInfo::generateOperandStruct(std::ostream& out)
{
    out << "struct Opcode_" << name << "\n";
    out << "{\n";
    out << "    TranslatedOpcode opcode;\n";

    auto sortedFields = fields;
    std::sort(sortedFields.begin(), sortedFields.end(), [](const Field& a, const Field& b) {
        return (a.to - a.from) > (b.to - b.from);
    });
    if(branch)
        out << "    uint32_t CIA;\n";

    for(const Field& f : sortedFields)
    {
        if(f.name.empty() || f.match)
            continue;
        out << "    ";
        if(f.to-f.from > 16)
            out << "uint32_t";
        else if(f.to-f.from > 8)
            out << "uint16_t";
        else
            out << "uint8_t";
        out << " " << f.name << ";\n";
    }
        
    out << "};\n\n";
}